

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int lhRecordOverwrite(lhcell *pCell,void *pData,unqlite_int64 nByte)

{
  undefined8 uVar1;
  sxu64 n64;
  int iVar2;
  uint local_98;
  sxu32 nLen;
  sxu32 iOld;
  sxu16 iOldOfft;
  sxu16 iOfft;
  int rc;
  pgno iOvfl;
  lhpage *plStack_78;
  sxu32 nAvail;
  lhpage *pPage;
  unqlite_page *pNew;
  unqlite_page *pOld;
  unqlite_page *pOvfl;
  uchar *zEnd;
  uchar *zPtr;
  uchar *zPayload;
  uchar *zRawEnd;
  uchar *zRaw;
  lhash_kv_engine *pEngine;
  unqlite_int64 nByte_local;
  void *pData_local;
  lhcell *pCell_local;
  
  zRaw = (uchar *)pCell->pPage->pHash;
  plStack_78 = pCell->pPage;
  pEngine = (lhash_kv_engine *)nByte;
  nByte_local = (unqlite_int64)pData;
  pData_local = pCell;
  iOld = (*((lhash_kv_engine *)zRaw)->pIo->xWrite)(plStack_78->pRaw);
  pCell_local._4_4_ = iOld;
  if (iOld == 0) {
    if (*(long *)((long)pData_local + 0x18) == 0) {
      zPtr = plStack_78->pRaw->zData +
             (*(ushort *)((long)pData_local + 0x28) + 0x1a + *(int *)((long)pData_local + 4));
      if (*(lhash_kv_engine **)((long)pData_local + 8) == pEngine) {
        SyMemcpy((void *)nByte_local,zPtr,(sxu32)pEngine);
      }
      else if (pEngine < *(lhash_kv_engine **)((long)pData_local + 8)) {
        SyMemcpy((void *)nByte_local,zPtr,(sxu32)pEngine);
        SyBigEndianPack64(plStack_78->pRaw->zData + (int)(*(ushort *)((long)pData_local + 0x28) + 8)
                          ,(sxu64)pEngine);
        lhRestoreSpace(plStack_78,
                       *(short *)((long)pData_local + 0x28) + 0x1a +
                       (short)*(undefined4 *)((long)pData_local + 4) + (short)pEngine,
                       (short)*(undefined8 *)((long)pData_local + 8) - (short)pEngine);
        *(lhash_kv_engine **)((long)pData_local + 8) = pEngine;
      }
      else {
        nLen._2_2_ = 0;
        iOld = lhAllocateSpace(plStack_78,
                               (long)(pEngine->sAllocator).apPool +
                               ((ulong)(*(int *)((long)pData_local + 4) + 0x1a) - 0x48),
                               (sxu16 *)((long)&nLen + 2));
        if (iOld == 0) {
          nLen._0_2_ = *(sxu16 *)((long)pData_local + 0x28);
          uVar1 = *(undefined8 *)((long)pData_local + 8);
          lhMoveLocalCell((lhcell *)pData_local,nLen._2_2_,(void *)nByte_local,
                          (unqlite_int64)pEngine);
          lhRestoreSpace(plStack_78,(sxu16)nLen,
                         (short)*(undefined4 *)((long)pData_local + 4) + 0x1a + (short)uVar1);
        }
        else {
          iOld = lhCellWriteOvflPayload
                           ((lhcell *)pData_local,
                            plStack_78->pRaw->zData +
                            (int)(*(ushort *)((long)pData_local + 0x28) + 0x1a),
                            *(sxu32 *)((long)pData_local + 4),nByte_local,pEngine,0);
          if (iOld != 0) {
            return iOld;
          }
          SyBigEndianPack64(plStack_78->pRaw->zData +
                            (int)(*(ushort *)((long)pData_local + 0x28) + 8),(sxu64)pEngine);
          lhRestoreSpace(plStack_78,*(short *)((long)pData_local + 0x28) + 0x1a,
                         (short)*(undefined4 *)((long)pData_local + 4) +
                         (short)*(undefined8 *)((long)pData_local + 8));
          *(lhash_kv_engine **)((long)pData_local + 8) = pEngine;
        }
      }
      pCell_local._4_4_ = 0;
    }
    else {
      iOld = (**(code **)(*(long *)zRaw + 0x10))
                       (**(undefined8 **)zRaw,*(undefined8 *)((long)pData_local + 0x30),&pOld);
      pCell_local._4_4_ = iOld;
      if (iOld == 0) {
        SyBigEndianUnpack64(pOld->zData,(sxu64 *)&iOldOfft);
        pNew = pOld;
        while ((_iOldOfft != 0 &&
               (iVar2 = (**(code **)(*(long *)zRaw + 0x10))(**(undefined8 **)zRaw,_iOldOfft,&pNew),
               iVar2 == 0))) {
          SyBigEndianUnpack64(pNew->zData,(sxu64 *)&iOldOfft);
          if (pNew != pOld) {
            lhRestorePage((lhash_kv_engine *)zRaw,pNew);
            (**(code **)(*(long *)zRaw + 0x50))(pNew);
          }
        }
        zRawEnd = pOld->zData + *(ushort *)((long)pData_local + 0x38);
        zPayload = pOld->zData + *(int *)(zRaw + 0x110);
        zEnd = (uchar *)nByte_local;
        pOvfl = (unqlite_page *)((long)(pEngine->sAllocator).apPool + nByte_local + -0x48);
        iOld = (**(code **)(*(long *)zRaw + 0x28))(pOld);
        pCell_local._4_4_ = iOld;
        if (iOld == 0) {
          SyBigEndianPack64(pOld->zData,0);
          for (; zEnd < pOvfl; zEnd = zEnd + local_98) {
            if (zPayload <= zRawEnd) {
              iOld = lhAcquirePage((lhash_kv_engine *)zRaw,(unqlite_page **)&pPage);
              if (iOld != 0) {
                return iOld;
              }
              iOld = (**(code **)(*(long *)zRaw + 0x28))(pPage);
              if (iOld != 0) {
                return iOld;
              }
              n64._0_2_ = (pPage->sHdr).iOfft;
              n64._2_2_ = (pPage->sHdr).iFree;
              n64._4_4_ = *(undefined4 *)&(pPage->sHdr).field_0x4;
              SyBigEndianPack64(pOld->zData,n64);
              (**(code **)(*(long *)zRaw + 0x50))(pOld);
              SyBigEndianPack64((uchar *)pPage->pHash,0);
              pOld = (unqlite_page *)pPage;
              zRawEnd = (uchar *)&pPage->pHash->sAllocator;
              zPayload = (uchar *)((long)(pPage->pHash->sAllocator).apPool +
                                  (long)*(int *)(zRaw + 0x110) + -0x48);
            }
            iOvfl._4_4_ = (int)zPayload - (int)zRawEnd;
            local_98 = (int)pOvfl - (int)zEnd;
            if (iOvfl._4_4_ < local_98) {
              local_98 = iOvfl._4_4_;
            }
            SyMemcpy(zEnd,zRawEnd,local_98);
            zRawEnd = zRawEnd + local_98;
          }
          (**(code **)(*(long *)zRaw + 0x50))(pOld);
          *(lhash_kv_engine **)((long)pData_local + 8) = pEngine;
          SyBigEndianPack64(plStack_78->pRaw->zData +
                            (int)(*(ushort *)((long)pData_local + 0x28) + 8),
                            *(sxu64 *)((long)pData_local + 8));
          pCell_local._4_4_ = 0;
        }
      }
    }
  }
  return pCell_local._4_4_;
}

Assistant:

static int lhRecordOverwrite(
	lhcell *pCell,
	const void *pData,unqlite_int64 nByte
	)
{
	lhash_kv_engine *pEngine = pCell->pPage->pHash;
	unsigned char *zRaw,*zRawEnd,*zPayload;
	const unsigned char *zPtr,*zEnd;
	unqlite_page *pOvfl,*pOld,*pNew;
	lhpage *pPage = pCell->pPage;
	sxu32 nAvail;
	pgno iOvfl;
	int rc;
	/* Acquire a writer lock on this page */
	rc = pEngine->pIo->xWrite(pPage->pRaw);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	if( pCell->iOvfl == 0 ){
		/* Local payload, try to deal with the free space issues */
		zPayload = &pPage->pRaw->zData[pCell->iStart + L_HASH_CELL_SZ + pCell->nKey];
		if( pCell->nData == (sxu64)nByte ){
			/* Best scenario, simply a memcpy operation */
			SyMemcpy(pData,(void *)zPayload,(sxu32)nByte);
		}else if( (sxu64)nByte < pCell->nData ){
			/* Shorter data, not so ugly */
			SyMemcpy(pData,(void *)zPayload,(sxu32)nByte);
			/* Update the cell header */
			SyBigEndianPack64(&pPage->pRaw->zData[pCell->iStart + 4 /* Hash */ + 4 /* Key */],nByte);
			/* Restore freespace */
			lhRestoreSpace(pPage,(sxu16)(pCell->iStart + L_HASH_CELL_SZ + pCell->nKey + nByte),(sxu16)(pCell->nData - nByte));
			/* New data size */
			pCell->nData = (sxu64)nByte;
		}else{
			sxu16 iOfft = 0; /* cc warning */
			/* Check if another chunk is available for this cell */
			rc = lhAllocateSpace(pPage,L_HASH_CELL_SZ + pCell->nKey + nByte,&iOfft);
			if( rc != UNQLITE_OK ){
				/* Transfer the payload to an overflow page */
				rc = lhCellWriteOvflPayload(pCell,&pPage->pRaw->zData[pCell->iStart + L_HASH_CELL_SZ],pCell->nKey,pData,nByte,(const void *)0);
				if( rc != UNQLITE_OK ){
					return rc;
				}
				/* Update the cell header */
				SyBigEndianPack64(&pPage->pRaw->zData[pCell->iStart + 4 /* Hash */ + 4 /* Key */],(sxu64)nByte);
				/* Restore freespace */
				lhRestoreSpace(pPage,(sxu16)(pCell->iStart + L_HASH_CELL_SZ),(sxu16)(pCell->nKey + pCell->nData));
				/* New data size */
				pCell->nData = (sxu64)nByte;
			}else{
				sxu16 iOldOfft = pCell->iStart;
				sxu32 iOld = (sxu32)pCell->nData;
				/* Space is available, transfer the cell */
				lhMoveLocalCell(pCell,iOfft,pData,nByte);
				/* Restore cell space */
				lhRestoreSpace(pPage,iOldOfft,(sxu16)(L_HASH_CELL_SZ + pCell->nKey + iOld));
			}
		}
		return UNQLITE_OK;
	}
	/* Point to the overflow page */
	rc = pEngine->pIo->xGet(pEngine->pIo->pHandle,pCell->iDataPage,&pOvfl);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	/* Relase all old overflow pages first */
	SyBigEndianUnpack64(pOvfl->zData,&iOvfl);
	pOld = pOvfl;
	for(;;){
		if( iOvfl == 0 ){
			/* No more overflow pages on the chain */
			break;
		}
		/* Point to the target page */
		if( UNQLITE_OK != pEngine->pIo->xGet(pEngine->pIo->pHandle,iOvfl,&pOld) ){
			/* Not so fatal if something goes wrong here */
			break;
		}
		/* Next overflow page to be released */
		SyBigEndianUnpack64(pOld->zData,&iOvfl);
		if( pOld != pOvfl ){ /* xx: chm is maniac */
			/* Restore the page to the free list */
			lhRestorePage(pEngine,pOld);
			/* Unref */
			pEngine->pIo->xPageUnref(pOld);
		}
	}
	/* Point to the data offset */
	zRaw = &pOvfl->zData[pCell->iDataOfft];
	zRawEnd = &pOvfl->zData[pEngine->iPageSize];
	/* The data to be stored */
	zPtr = (const unsigned char *)pData;
	zEnd = &zPtr[nByte];
	/* Start the overwrite process */
	/* Acquire a writer lock */
	rc = pEngine->pIo->xWrite(pOvfl);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	SyBigEndianPack64(pOvfl->zData,0);
	for(;;){
		sxu32 nLen;
		if( zPtr >= zEnd ){
			break;
		}
		if( zRaw >= zRawEnd ){
			/* Acquire a new page */
			rc = lhAcquirePage(pEngine,&pNew);
			if( rc != UNQLITE_OK ){
				return rc;
			}
			rc = pEngine->pIo->xWrite(pNew);
			if( rc != UNQLITE_OK ){
				return rc;
			}
			/* Link */
			SyBigEndianPack64(pOvfl->zData,pNew->iPage);
			pEngine->pIo->xPageUnref(pOvfl);
			SyBigEndianPack64(pNew->zData,0); /* Next overflow page on the chain */
			pOvfl = pNew;
			zRaw = &pNew->zData[8];
			zRawEnd = &pNew->zData[pEngine->iPageSize];
		}
		nAvail = (sxu32)(zRawEnd-zRaw);
		nLen = (sxu32)(zEnd-zPtr);
		if( nLen > nAvail ){
			nLen = nAvail;
		}
		SyMemcpy((const void *)zPtr,(void *)zRaw,nLen);
		/* Synchronize pointers */
		zPtr += nLen;
		zRaw += nLen;
	}
	/* Unref the last overflow page */
	pEngine->pIo->xPageUnref(pOvfl);
	/* Finally, update the cell header */
	pCell->nData = (sxu64)nByte;
	SyBigEndianPack64(&pPage->pRaw->zData[pCell->iStart + 4 /* Hash */ + 4 /* Key */],pCell->nData);
	/* All done */
	return UNQLITE_OK;
}